

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionType.cpp
# Opt level: O0

int __thiscall
hdc::FunctionType::clone
          (FunctionType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  FunctionType *this_00;
  ulong uVar2;
  size_type sVar3;
  vector<hdc::Type_*,_std::allocator<hdc::Type_*>_> *this_01;
  reference ppTVar4;
  undefined4 extraout_var;
  value_type local_30;
  int local_28;
  int i;
  FunctionType *local_18;
  FunctionType *cloned;
  FunctionType *this_local;
  
  cloned = this;
  this_00 = (FunctionType *)operator_new(0x30);
  FunctionType(this_00);
  local_28 = 0;
  local_18 = this_00;
  while( true ) {
    uVar2 = (ulong)local_28;
    sVar3 = std::vector<hdc::Type_*,_std::allocator<hdc::Type_*>_>::size(&this->subtypes);
    if (sVar3 <= uVar2) break;
    this_01 = &local_18->subtypes;
    ppTVar4 = std::vector<hdc::Type_*,_std::allocator<hdc::Type_*>_>::operator[]
                        (&this->subtypes,(long)local_28);
    iVar1 = (*((*ppTVar4)->super_ASTNode)._vptr_ASTNode[3])();
    local_30 = (value_type)CONCAT44(extraout_var,iVar1);
    std::vector<hdc::Type_*,_std::allocator<hdc::Type_*>_>::push_back(this_01,&local_30);
    local_28 = local_28 + 1;
  }
  return (int)local_18;
}

Assistant:

Type *FunctionType::clone() {
    FunctionType* cloned = new FunctionType();

    for (int i = 0; i < subtypes.size(); ++i) {
        cloned->subtypes.push_back(subtypes[i]->clone());
    }

    return cloned;
}